

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrapolation.cc
# Opt level: O2

void __thiscall
tchecker::zg::details::local_m_extrapolation_t::local_m_extrapolation_t
          (local_m_extrapolation_t *this,
          shared_ptr<const_tchecker::clockbounds::local_m_map_t> *clock_bounds)

{
  clock_id_t cVar1;
  map_t *pmVar2;
  
  (this->super_extrapolation_t)._vptr_extrapolation_t =
       (_func_int **)&PTR__local_m_extrapolation_t_0025e7b0;
  this->_m = (map_t *)0x0;
  std::__shared_ptr<const_tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&(this->_clock_bounds).
                super___shared_ptr<const_tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>
               ,&clock_bounds->
                 super___shared_ptr<const_tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>
              );
  cVar1 = clockbounds::local_m_map_t::clock_number
                    ((this->_clock_bounds).
                     super___shared_ptr<const_tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  pmVar2 = clockbounds::allocate_map((ulong)cVar1);
  this->_m = pmVar2;
  return;
}

Assistant:

local_m_extrapolation_t::local_m_extrapolation_t(
    std::shared_ptr<tchecker::clockbounds::local_m_map_t const> const & clock_bounds)
    : _m(nullptr), _clock_bounds(clock_bounds)
{
  _m = tchecker::clockbounds::allocate_map(_clock_bounds->clock_number());
}